

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O3

int gray_convert_glyph(gray_PWorker worker)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  size_t __n;
  uchar uVar10;
  int iVar11;
  uint uVar12;
  PCell_conflict pTVar13;
  uchar *__s;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uchar *puVar17;
  int *piVar18;
  uint uVar19;
  TCoord TVar20;
  int fill;
  FT_Span span [16];
  TCoord bands [32];
  TCell buffer [682];
  FT_Span local_4108 [16];
  int local_40a8;
  int local_40a4;
  TCell_ local_4028 [681];
  TCell_ local_50;
  
  local_40a4 = worker->min_ey;
  iVar1 = worker->max_ey;
  uVar4 = iVar1 - local_40a4;
  worker->cell_null = &local_50;
  local_50.x = 0x7fffffff;
  local_50.cover = 0;
  local_50.area = 0;
  local_50.next = (PCell)0x0;
  worker->ycells = (PCell_conflict *)local_4028;
  if (0x55 < uVar4) {
    uVar6 = ((long)(int)uVar4 + 0x54U) / 0x55;
    uVar4 = (uint)((((long)(int)uVar4 + uVar6) - 1) / uVar6);
  }
  if (local_40a4 < iVar1) {
    iVar2 = 0;
    do {
      piVar18 = &local_40a8;
      worker->min_ey = local_40a4;
      iVar8 = local_40a4 + uVar4;
      local_40a8 = iVar1;
      if (iVar8 < iVar1) {
        local_40a8 = iVar8;
      }
      worker->max_ey = local_40a8;
      do {
        iVar5 = piVar18[1];
        uVar6 = (long)*piVar18 - (long)iVar5;
        pTVar13 = worker->cell_null;
        uVar19 = (uint)uVar6;
        if (0 < (int)uVar19) {
          uVar9 = 0;
          do {
            worker->ycells[uVar9] = pTVar13;
            uVar9 = uVar9 + 1;
          } while ((uVar6 & 0xffffffff) != uVar9);
          pTVar13 = worker->cell_null;
        }
        worker->cell_free = local_4028 + (uVar6 * 8 + 0x17) / 0x18;
        worker->cell = pTVar13;
        worker->min_ey = iVar5;
        worker->max_ey = *piVar18;
        worker->count_ey = uVar19;
        iVar2 = gray_convert_glyph_inner(worker,iVar2);
        if (iVar2 == 0x62) {
          if (uVar19 < 2) {
            return 0x62;
          }
          piVar18[2] = piVar18[1];
          piVar18[1] = ((int)uVar19 >> 1) + piVar18[1];
          piVar18 = piVar18 + 1;
        }
        else {
          if (iVar2 != 0) {
            return iVar2;
          }
          uVar19 = (worker->outline).flags;
          uVar15 = 0x100;
          if ((uVar19 & 2) == 0) {
            uVar15 = 0x80000000;
          }
          if (worker->render_span == (FT_SpanFunc)0x0) {
            for (TVar20 = worker->min_ey; TVar20 < worker->max_ey; TVar20 = TVar20 + 1) {
              pTVar13 = worker->ycells[(long)TVar20 - (long)worker->min_ey];
              if (pTVar13 != worker->cell_null) {
                puVar17 = (worker->target).origin;
                lVar7 = (long)(worker->target).pitch * (long)TVar20;
                uVar6 = (ulong)(uint)worker->min_ex;
                iVar2 = 0;
                do {
                  if (iVar2 != 0) {
                    iVar11 = (int)uVar6;
                    iVar5 = pTVar13->x - iVar11;
                    if (iVar5 != 0 && iVar11 <= pTVar13->x) {
                      uVar14 = -(uint)((iVar2 >> 9 & uVar15) != 0) ^ iVar2 >> 9;
                      uVar12 = uVar14;
                      if ((uVar19 & 2) == 0) {
                        uVar12 = 0xff;
                      }
                      if ((int)uVar14 < 0x100) {
                        uVar12 = uVar14;
                      }
                      __s = puVar17 + (iVar11 - lVar7);
                      uVar10 = (uchar)uVar12;
                      switch(iVar5) {
                      case 0:
                        break;
                      case 7:
                        *__s = uVar10;
                        __s = __s + 1;
                      case 6:
                        *__s = uVar10;
                        __s = __s + 1;
                      case 5:
                        *__s = uVar10;
                        __s = __s + 1;
                      case 4:
                        *__s = uVar10;
                        __s = __s + 1;
                      case 3:
                        *__s = uVar10;
                        __s = __s + 1;
                      case 2:
                        *__s = uVar10;
                        __s = __s + 1;
                      case 1:
                        *__s = uVar10;
                        break;
                      default:
                        memset(__s,uVar12,(long)iVar5);
                      }
                    }
                  }
                  iVar5 = pTVar13->x;
                  iVar2 = pTVar13->cover * 0x200 + iVar2;
                  iVar11 = iVar2 - pTVar13->area;
                  if ((iVar11 != 0) && (worker->min_ex <= iVar5)) {
                    uVar14 = iVar11 >> 9;
                    uVar14 = -(uint)((uVar14 & uVar15) != 0) ^ uVar14;
                    uVar12 = (uint)(byte)(-((uVar19 & 2) == 0) | (byte)uVar14);
                    if ((int)uVar14 < 0x100) {
                      uVar12 = uVar14;
                    }
                    puVar17[iVar5 - lVar7] = (uchar)uVar12;
                    iVar5 = pTVar13->x;
                  }
                  uVar6 = (long)iVar5 + 1;
                  pTVar13 = pTVar13->next;
                } while (pTVar13 != worker->cell_null);
                if (iVar2 != 0) {
                  uVar14 = -(uint)((iVar2 >> 9 & uVar15) != 0) ^ iVar2 >> 9;
                  uVar12 = uVar14;
                  if ((uVar19 & 2) == 0) {
                    uVar12 = 0xff;
                  }
                  if ((int)uVar14 < 0x100) {
                    uVar12 = uVar14;
                  }
                  puVar17 = puVar17 + ((int)uVar6 - lVar7);
                  __n = (long)worker->max_ex - uVar6;
                  uVar10 = (uchar)uVar12;
                  switch(__n & 0xffffffff) {
                  case 0:
                    break;
                  case 7:
                    *puVar17 = uVar10;
                    puVar17 = puVar17 + 1;
                  case 6:
                    *puVar17 = uVar10;
                    puVar17 = puVar17 + 1;
                  case 5:
                    *puVar17 = uVar10;
                    puVar17 = puVar17 + 1;
                  case 4:
                    *puVar17 = uVar10;
                    puVar17 = puVar17 + 1;
                  case 3:
                    *puVar17 = uVar10;
                    puVar17 = puVar17 + 1;
                  case 2:
                    *puVar17 = uVar10;
                    puVar17 = puVar17 + 1;
                  case 1:
                    *puVar17 = uVar10;
                    break;
                  default:
                    memset(puVar17,uVar12,__n);
                  }
                }
              }
            }
          }
          else {
            for (iVar2 = worker->min_ey; iVar2 < worker->max_ey; iVar2 = iVar2 + 1) {
              pTVar13 = worker->ycells[(long)iVar2 - (long)worker->min_ey];
              if (pTVar13 != worker->cell_null) {
                iVar5 = worker->min_ex;
                iVar16 = 0;
                iVar11 = 0;
                do {
                  iVar3 = pTVar13->x;
                  if ((iVar16 != 0) && (iVar3 - iVar5 != 0 && iVar5 <= iVar3)) {
                    uVar14 = -(uint)((iVar16 >> 9 & uVar15) != 0) ^ iVar16 >> 9;
                    uVar12 = (uint)(byte)(-((uVar19 & 2) == 0) | (byte)uVar14);
                    if ((int)uVar14 < 0x100) {
                      uVar12 = uVar14;
                    }
                    local_4108[iVar11].coverage = (uchar)uVar12;
                    local_4108[iVar11].x = (short)iVar5;
                    local_4108[iVar11].len = (unsigned_short)(iVar3 - iVar5);
                    iVar11 = iVar11 + 1;
                    if (iVar11 == 0x10) {
                      (*worker->render_span)(iVar2,0x10,local_4108,worker->render_span_data);
                      iVar3 = pTVar13->x;
                      iVar11 = 0;
                    }
                  }
                  iVar16 = pTVar13->cover * 0x200 + iVar16;
                  iVar5 = iVar16 - pTVar13->area;
                  if ((iVar5 != 0) && (worker->min_ex <= iVar3)) {
                    uVar14 = iVar5 >> 9;
                    uVar14 = -(uint)((uVar14 & uVar15) != 0) ^ uVar14;
                    uVar12 = (uint)(byte)(-((uVar19 & 2) == 0) | (byte)uVar14);
                    if ((int)uVar14 < 0x100) {
                      uVar12 = uVar14;
                    }
                    local_4108[iVar11].coverage = (uchar)uVar12;
                    local_4108[iVar11].x = (short)iVar3;
                    local_4108[iVar11].len = 1;
                    iVar11 = iVar11 + 1;
                    if (iVar11 == 0x10) {
                      (*worker->render_span)(iVar2,0x10,local_4108,worker->render_span_data);
                      iVar3 = pTVar13->x;
                      iVar11 = 0;
                    }
                  }
                  iVar5 = iVar3 + 1;
                  pTVar13 = pTVar13->next;
                } while (pTVar13 != worker->cell_null);
                if (iVar16 != 0) {
                  uVar14 = -(uint)((iVar16 >> 9 & uVar15) != 0) ^ iVar16 >> 9;
                  uVar12 = (uint)(byte)(-((uVar19 & 2) == 0) | (byte)uVar14);
                  if ((int)uVar14 < 0x100) {
                    uVar12 = uVar14;
                  }
                  local_4108[iVar11].coverage = (uchar)uVar12;
                  local_4108[iVar11].x = (short)iVar5;
                  local_4108[iVar11].len = (short)worker->max_ex - (short)iVar5;
                  iVar11 = iVar11 + 1;
                }
                if (iVar11 != 0) {
                  (*worker->render_span)(iVar2,iVar11,local_4108,worker->render_span_data);
                }
              }
            }
          }
          piVar18 = piVar18 + -1;
        }
        iVar2 = 1;
      } while (&local_40a8 <= piVar18);
      iVar2 = 1;
      local_40a4 = iVar8;
    } while (iVar8 < iVar1);
  }
  return 0;
}

Assistant:

static int
  gray_convert_glyph( RAS_ARG )
  {
    const TCoord  yMin = ras.min_ey;
    const TCoord  yMax = ras.max_ey;

    TCell    buffer[FT_MAX_GRAY_POOL];
    size_t   height = (size_t)( yMax - yMin );
    size_t   n = FT_MAX_GRAY_POOL / 8;
    TCoord   y;
    TCoord   bands[32];  /* enough to accommodate bisections */
    TCoord*  band;

    int  continued = 0;


    /* Initialize the null cell at the end of the poll. */
    ras.cell_null        = buffer + FT_MAX_GRAY_POOL - 1;
    ras.cell_null->x     = CELL_MAX_X_VALUE;
    ras.cell_null->area  = 0;
    ras.cell_null->cover = 0;
    ras.cell_null->next  = NULL;

    /* set up vertical bands */
    ras.ycells     = (PCell*)buffer;

    if ( height > n )
    {
      /* two divisions rounded up */
      n       = ( height + n - 1 ) / n;
      height  = ( height + n - 1 ) / n;
    }

    for ( y = yMin; y < yMax; )
    {
      ras.min_ey = y;
      y         += height;
      ras.max_ey = FT_MIN( y, yMax );

      band    = bands;
      band[1] = ras.min_ey;
      band[0] = ras.max_ey;

      do
      {
        TCoord  width = band[0] - band[1];
        TCoord  w;
        int     error;


        for ( w = 0; w < width; ++w )
          ras.ycells[w] = ras.cell_null;

        /* memory management: skip ycells */
        n = ( (size_t)width * sizeof ( PCell ) + sizeof ( TCell ) - 1 ) /
              sizeof ( TCell );

        ras.cell_free = buffer + n;
        ras.cell      = ras.cell_null;
        ras.min_ey    = band[1];
        ras.max_ey    = band[0];
        ras.count_ey  = width;

        error     = gray_convert_glyph_inner( RAS_VAR_ continued );
        continued = 1;

        if ( !error )
        {
          if ( ras.render_span )  /* for FT_RASTER_FLAG_DIRECT only */
            gray_sweep_direct( RAS_VAR );
          else
            gray_sweep( RAS_VAR );
          band--;
          continue;
        }
        else if ( error != Smooth_Err_Raster_Overflow )
          return error;

        /* render pool overflow; we will reduce the render band by half */
        width >>= 1;

        /* this should never happen even with tiny rendering pool */
        if ( width == 0 )
        {
          FT_TRACE7(( "gray_convert_glyph: rotten glyph\n" ));
          return FT_THROW( Raster_Overflow );
        }

        band++;
        band[1]  = band[0];
        band[0] += width;
      } while ( band >= bands );
    }

    return Smooth_Err_Ok;
  }